

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

Writer * __thiscall el::base::Writer::construct(Writer *this,int count,char *loggerIds,...)

{
  string *loggerId;
  char in_AL;
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 in_RCX;
  ulong uVar3;
  char *pcVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list loggersList;
  allocator local_129;
  ulong local_128;
  undefined8 *local_120;
  undefined1 *local_118;
  string local_108;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if ((*(byte *)(elStorage + 0x20) & 0x80) == 0) {
    std::__cxx11::string::string((string *)&local_108,loggerIds,(allocator *)&local_128);
    initializeLogger(this,&local_108,true,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_118 = local_e8;
    local_120 = (undefined8 *)&stack0x00000008;
    local_128 = 0x3000000018;
    if (0 < count) {
      do {
        std::__cxx11::string::string((string *)&local_108,loggerIds,&local_129);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->m_loggerIds,&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        uVar3 = local_128 & 0xffffffff;
        if (uVar3 < 0x29) {
          local_128 = CONCAT44(local_128._4_4_,(int)local_128 + 8);
          puVar1 = (undefined8 *)(local_118 + uVar3);
        }
        else {
          puVar1 = local_120;
          local_120 = local_120 + 1;
        }
        loggerIds = (char *)*puVar1;
        count = count + -1;
      } while (count != 0);
    }
    loggerId = (string *)
               (this->m_loggerIds).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((string *)
        (this->m_loggerIds).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == loggerId) {
      uVar2 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,0,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar2);
    }
    initializeLogger(this,loggerId,true,true);
  }
  (this->m_messageBuilder).m_logger = this->m_logger;
  pcVar4 = "\n    ";
  if ((*(byte *)(elStorage + 0x20) & 1) == 0) {
    pcVar4 = ", ";
  }
  (this->m_messageBuilder).m_containerLogSeperator = pcVar4;
  return this;
}

Assistant:

Writer& Writer::construct(int count, const char* loggerIds, ...) {
  if (ELPP->hasFlag(LoggingFlag::MultiLoggerSupport)) {
    va_list loggersList;
    va_start(loggersList, loggerIds);
    const char* id = loggerIds;
    for (int i = 0; i < count; ++i) {
      m_loggerIds.push_back(std::string(id));
      id = va_arg(loggersList, const char*);
    }
    va_end(loggersList);
    initializeLogger(m_loggerIds.at(0));
  } else {
    initializeLogger(std::string(loggerIds));
  }
  m_messageBuilder.initialize(m_logger);
  return *this;
}